

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O0

void __thiscall
slang::ast::DistVarVisitor::visit<slang::ast::HierarchicalReferenceExpression>
          (DistVarVisitor *this,HierarchicalReferenceExpression *expr)

{
  ExpressionKind EVar1;
  RandMode RVar2;
  Symbol *symbol;
  RandMode mode;
  Symbol *sym;
  HierarchicalReferenceExpression *expr_local;
  DistVarVisitor *this_local;
  
  EVar1 = (expr->super_Expression).kind;
  if (((EVar1 - NamedValue < 2) || (EVar1 - ElementSelect < 3)) &&
     (symbol = Expression::getSymbolReference(&expr->super_Expression,true), symbol != (Symbol *)0x0
     )) {
    RVar2 = ASTContext::getRandMode(this->context,symbol);
    if (RVar2 == Rand) {
      this->anyRandVars = true;
    }
    else if (RVar2 == RandC) {
      ASTContext::addDiag(this->context,(DiagCode)0x330008,(expr->super_Expression).sourceRange);
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue:
                case ExpressionKind::MemberAccess:
                case ExpressionKind::ElementSelect:
                case ExpressionKind::RangeSelect: {
                    if (auto sym = expr.getSymbolReference()) {
                        RandMode mode = context.getRandMode(*sym);
                        if (mode == RandMode::Rand)
                            anyRandVars = true;
                        else if (mode == RandMode::RandC)
                            context.addDiag(diag::RandCInDist, expr.sourceRange);
                    }
                    break;
                }
                default:
                    if constexpr (is_detected_v<ASTDetectors::visitExprs_t, T, DistVarVisitor>)
                        expr.visitExprs(*this);
                    break;
            }
        }
    }